

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O3

void Am_Pop_Up_Generalize_DB(Am_Object *script_window,Am_Value_List *sel_list)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  Am_Object main_script_line_part;
  Am_Value value;
  Am_Object obj;
  ostrstream oss;
  char line [250];
  Am_Object local_2d0;
  Am_Value local_2c8;
  Am_Object local_2b8;
  Am_Object local_2b0;
  Am_Object local_2a8;
  Am_Value_List local_2a0 [22];
  char local_138 [264];
  
  Am_Value_List::Start(sel_list);
  pAVar4 = Am_Value_List::Get(sel_list);
  Am_Object::Am_Object(&local_2d0,pAVar4);
  pAVar4 = Am_Object::Get(&local_2d0,0xb8,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (am_sdebug != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sel ",4);
    poVar5 = operator<<((ostream *)&std::cout,&local_2d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," slot ",6);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ostream::flush();
  }
  if ((uVar3 & 0xffff) == 0x16d) {
    popup_generalize_script_objects(&local_2d0,script_window,sel_list);
    goto LAB_001fd5b1;
  }
  pAVar4 = Am_Object::Get(&local_2d0,0x169,0);
  Am_Value::Am_Value(&local_2c8,pAVar4);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Value for value is ",0x13);
    poVar5 = operator<<((ostream *)&std::cout,&local_2c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ostream::flush();
  }
  bVar1 = Am_Inter_Location::Test(&local_2c8);
  if (bVar1) {
LAB_001fd597:
    popup_generalize_script_location(&local_2d0,script_window,sel_list);
  }
  else {
    if (local_2c8.type == 0xa001) {
      Am_Object::Am_Object((Am_Object *)local_2a0,&local_2c8);
      Am_Object::Am_Object(&local_2a8,&Am_Inter_Location_Placeholder);
      bVar1 = Am_Object::Is_Instance_Of((Am_Object *)local_2a0,&local_2a8);
      Am_Object::~Am_Object(&local_2a8);
      Am_Object::~Am_Object((Am_Object *)local_2a0);
      if (bVar1) goto LAB_001fd597;
    }
    bVar1 = Am_Value_List::Test(&local_2c8);
    if (bVar1) {
      Am_Value_List::Am_Value_List(local_2a0,&local_2c8);
      uVar2 = Am_Value_List::Length(local_2a0);
      Am_Value_List::~Am_Value_List(local_2a0);
      if (1 < uVar2) {
        std::ostrstream::ostrstream((ostrstream *)local_2a0,local_138,0xfa,_S_out);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,
                   "Generalizing on List of Values not yet implemented.  Select one value in list.",
                   0x4e);
        std::ostream::put((char)local_2a0);
        Am_Pop_Up_Error_Window(local_138);
        std::ostrstream::~ostrstream((ostrstream *)local_2a0);
        goto LAB_001fd5a7;
      }
    }
    if (local_2c8.type == 0xa001) {
      Am_Object::Am_Object(&local_2b8,&local_2c8);
      Am_Object::Am_Object(&local_2b0,&Am_A_Placeholder);
      bVar1 = Am_Object::Is_Instance_Of(&local_2b8,&local_2b0);
      Am_Object::~Am_Object(&local_2b0);
      if (bVar1) {
        pAVar4 = Am_Object::Get(&local_2b8,0x169,0);
        Am_Value::Am_Value((Am_Value *)local_2a0,pAVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"for placeholder ",0x10);
        poVar5 = operator<<((ostream *)&std::cout,&local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," found old val ",0xf);
        poVar5 = operator<<(poVar5,(Am_Value *)local_2a0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::ostream::flush();
        if ((short)local_2a0[0].data == -0x5fff) {
          popup_generalize_script_objects(&local_2d0,script_window,sel_list);
        }
        else {
          popup_generalize_script_value(&local_2c8,&local_2d0,script_window,sel_list);
        }
        Am_Value::~Am_Value((Am_Value *)local_2a0);
      }
      else if ((uVar3 & 0xffff) == 0x169) {
        std::ostrstream::ostrstream((ostrstream *)local_2a0,local_138,0xfa,_S_out);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,"Can\'t generalize on Objects returned from commands.",0x33)
        ;
        std::ostream::put((char)local_2a0);
        Am_Pop_Up_Error_Window(local_138);
        std::ostrstream::~ostrstream((ostrstream *)local_2a0);
      }
      else {
        popup_generalize_script_objects(&local_2d0,script_window,sel_list);
      }
      Am_Object::~Am_Object(&local_2b8);
    }
    else {
      popup_generalize_script_value(&local_2c8,&local_2d0,script_window,sel_list);
    }
  }
LAB_001fd5a7:
  Am_Value::~Am_Value(&local_2c8);
LAB_001fd5b1:
  Am_Object::~Am_Object(&local_2d0);
  return;
}

Assistant:

void
Am_Pop_Up_Generalize_DB(Am_Object &script_window, Am_Value_List &sel_list)
{
  sel_list.Start();
  Am_Object main_script_line_part = sel_list.Get();
  Am_Slot_Key key =
      (Am_Slot_Key)(int)main_script_line_part.Get(Am_SLOTS_TO_SAVE);
  if (am_sdebug)
    std::cout << "sel " << main_script_line_part << " slot " << key << std::endl
              << std::flush;
  if (key == Am_OBJECT_MODIFIED) {
    popup_generalize_script_objects(main_script_line_part, script_window,
                                    sel_list);
  } else { //not object modified
    Am_Value value = main_script_line_part.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "Value for value is " << value << std::endl << std::flush;
    if (Am_Inter_Location::Test(value) ||
        (value.type == Am_OBJECT &&
         Am_Object(value).Is_Instance_Of(Am_Inter_Location_Placeholder))) {
      popup_generalize_script_location(main_script_line_part, script_window,
                                       sel_list);
    } else if (Am_Value_List::Test(value) &&
               Am_Value_List(value).Length() > 1) {
      AM_POP_UP_ERROR_WINDOW("Generalizing on List of Values not yet "
                             "implemented.  Select one value in list.");
    } else if (value.type == Am_OBJECT) {
      Am_Object obj = value;
      if (!obj.Is_Instance_Of(Am_A_Placeholder)) {
        // not a placeholder
        if (key == Am_VALUE) {
          AM_POP_UP_ERROR_WINDOW(
              "Can't generalize on Objects returned from commands.");
        } else
          popup_generalize_script_objects(main_script_line_part, script_window,
                                          sel_list);
      } else { //is a placeholder
        Am_Value old_val = obj.Get(Am_VALUE);
        std::cout << "for placeholder " << obj << " found old val " << old_val
                  << std::endl
                  << std::flush;
        if (old_val.type == Am_OBJECT)
          popup_generalize_script_objects(main_script_line_part, script_window,
                                          sel_list);
        else
          popup_generalize_script_value(value, main_script_line_part,
                                        script_window, sel_list);
      }
    } else // not an object
      popup_generalize_script_value(value, main_script_line_part, script_window,
                                    sel_list);
  }
}